

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv_pipe_bind(uv_pipe_t *handle,char *name)

{
  int __fd;
  int iVar1;
  char *s;
  int *piVar2;
  int local_a0;
  int err;
  int sockfd;
  char *pipe_fname;
  sockaddr_un saddr;
  char *name_local;
  uv_pipe_t *handle_local;
  
  if ((handle->io_watcher).fd < 0) {
    saddr.sun_path._100_8_ = name;
    s = uv__strdup(name);
    if (s == (char *)0x0) {
      handle_local._4_4_ = -0xc;
    }
    else {
      saddr.sun_path[100] = '\0';
      saddr.sun_path[0x65] = '\0';
      saddr.sun_path[0x66] = '\0';
      saddr.sun_path[0x67] = '\0';
      saddr.sun_path[0x68] = '\0';
      saddr.sun_path[0x69] = '\0';
      saddr.sun_path[0x6a] = '\0';
      saddr.sun_path[0x6b] = '\0';
      __fd = uv__socket(1,1,0);
      local_a0 = __fd;
      if (-1 < __fd) {
        memset((void *)((long)&pipe_fname + 2),0,0x6e);
        uv__strscpy((char *)((long)&pipe_fname + 4),s,0x6c);
        pipe_fname._2_2_ = 1;
        iVar1 = bind(__fd,(sockaddr *)((long)&pipe_fname + 2),0x6e);
        if (iVar1 == 0) {
          handle->flags = handle->flags | 0x2000;
          handle->pipe_fname = s;
          (handle->io_watcher).fd = __fd;
          return 0;
        }
        piVar2 = __errno_location();
        local_a0 = -*piVar2;
        if (local_a0 == -2) {
          local_a0 = -0xd;
        }
        uv__close(__fd);
      }
      uv__free(s);
      handle_local._4_4_ = local_a0;
    }
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_pipe_bind(uv_pipe_t* handle, const char* name) {
  struct sockaddr_un saddr;
  const char* pipe_fname;
  int sockfd;
  int err;

  pipe_fname = NULL;

  /* Already bound? */
  if (uv__stream_fd(handle) >= 0)
    return UV_EINVAL;

  /* Make a copy of the file name, it outlives this function's scope. */
  pipe_fname = uv__strdup(name);
  if (pipe_fname == NULL)
    return UV_ENOMEM;

  /* We've got a copy, don't touch the original any more. */
  name = NULL;

  err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
  if (err < 0)
    goto err_socket;
  sockfd = err;

  memset(&saddr, 0, sizeof saddr);
  uv__strscpy(saddr.sun_path, pipe_fname, sizeof(saddr.sun_path));
  saddr.sun_family = AF_UNIX;

  if (bind(sockfd, (struct sockaddr*)&saddr, sizeof saddr)) {
    err = UV__ERR(errno);
    /* Convert ENOENT to EACCES for compatibility with Windows. */
    if (err == UV_ENOENT)
      err = UV_EACCES;

    uv__close(sockfd);
    goto err_socket;
  }

  /* Success. */
  handle->flags |= UV_HANDLE_BOUND;
  handle->pipe_fname = pipe_fname; /* Is a strdup'ed copy. */
  handle->io_watcher.fd = sockfd;
  return 0;

err_socket:
  uv__free((void*)pipe_fname);
  return err;
}